

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O3

bool __thiscall winmd::reader::filter::includes(filter *this,TypeDef *type)

{
  table_base *ptVar1;
  database *pdVar2;
  bool bVar3;
  uint uVar4;
  string_view local_40;
  string_view local_30;
  
  ptVar1 = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  pdVar2 = ptVar1->m_database;
  uVar4 = table_base::get_value<unsigned_int>
                    (ptVar1,(type->super_row_base<winmd::reader::TypeDef>).m_index,2);
  local_30 = database::get_string(pdVar2,uVar4);
  ptVar1 = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  pdVar2 = ptVar1->m_database;
  uVar4 = table_base::get_value<unsigned_int>
                    (ptVar1,(type->super_row_base<winmd::reader::TypeDef>).m_index,1);
  local_40 = database::get_string(pdVar2,uVar4);
  bVar3 = includes(this,&local_30,&local_40);
  return bVar3;
}

Assistant:

bool includes(TypeDef const& type) const
        {
            return includes(type.TypeNamespace(), type.TypeName());
        }